

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Identifier __thiscall soul::heart::Parser::parseGeneralIdentifier(Parser *this)

{
  Allocator *this_00;
  string local_38;
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  this_00 = Program::getAllocator(&this->program);
  readGeneralIdentifier_abi_cxx11_(&local_38,this);
  this_local = (Parser *)Allocator::get<std::__cxx11::string>(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (Identifier)(string *)this_local;
}

Assistant:

Identifier parseGeneralIdentifier()
    {
        return program.getAllocator().get (readGeneralIdentifier());
    }